

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

string * __thiscall
LongReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LongReadsDatastore *this,size_t readID)

{
  int iVar1;
  __off_t __offset;
  long lVar2;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> *this_00;
  ulong __nbytes;
  string *this_01;
  char *pcVar3;
  allocator *paVar4;
  size_type __n;
  const_reference pvVar5;
  undefined8 uStack_90;
  string *local_88;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> *local_80;
  ulong local_78;
  LongReadsDatastore *local_70;
  string *local_68;
  char *local_60;
  allocator *local_58;
  allocator local_39;
  __off_t local_38;
  size_t read_offset_in_file;
  unsigned_long __vla_expr0;
  size_type local_20;
  size_t readID_local;
  LongReadsDatastore *this_local;
  
  local_80 = &this->read_to_fileRecord;
  uStack_90 = 0x3d590b;
  local_88 = __return_storage_ptr__;
  local_70 = this;
  local_68 = __return_storage_ptr__;
  local_20 = readID;
  readID_local = (size_t)this;
  this_local = (LongReadsDatastore *)__return_storage_ptr__;
  pvVar5 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::operator[](local_80,readID);
  __n = local_20;
  this_00 = local_80;
  local_78 = (ulong)(pvVar5->record_size + 1);
  lVar2 = -(local_78 + 0xf & 0xfffffffffffffff0);
  local_60 = (char *)((long)&local_88 + lVar2);
  read_offset_in_file = local_78;
  __vla_expr0 = (unsigned_long)&local_88;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d5944;
  pvVar5 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::operator[](this_00,__n);
  __offset = pvVar5->offset;
  iVar1 = local_70->fd;
  local_38 = __offset;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d5960;
  lseek(iVar1,__offset,0);
  pcVar3 = local_60;
  __nbytes = local_78;
  iVar1 = local_70->fd;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d5974;
  ::read(iVar1,pcVar3,__nbytes);
  local_58 = &local_39;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d5981;
  std::allocator<char>::allocator();
  paVar4 = local_58;
  pcVar3 = local_60;
  this_01 = local_68;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d5992;
  std::__cxx11::string::string((string *)this_01,pcVar3,paVar4);
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3d599d;
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return local_88;
}

Assistant:

std::string LongReadsDatastore::get_read_sequence(size_t readID) const {
    char buffer[read_to_fileRecord[readID].record_size+1];
    size_t read_offset_in_file=read_to_fileRecord[readID].offset;
    lseek(fd,read_offset_in_file,SEEK_SET);
    ::read(fd,buffer,sizeof(buffer));
    return std::string(buffer);
}